

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

ssize_t mqtt_pack_connection_request
                  (uint8_t *buf,size_t bufsz,char *client_id,char *will_topic,void *will_message,
                  size_t will_message_size,char *user_name,char *password,uint8_t connect_flags,
                  uint16_t keep_alive)

{
  uint16_t integer_htons;
  size_t sVar1;
  ssize_t sVar2;
  ssize_t sVar3;
  byte bVar4;
  char *__s;
  uint uVar5;
  uint8_t *puVar6;
  mqtt_fixed_header local_3c;
  
  local_3c.control_type = MQTT_CONTROL_CONNECT;
  local_3c._4_1_ = 0;
  __s = "";
  if (client_id != (char *)0x0) {
    __s = client_id;
  }
  if ((connect_flags & 2) == 0 && *__s == '\0') {
    return -0x7fffffe5;
  }
  sVar1 = strlen(__s);
  uVar5 = (int)sVar1 + 0xc;
  if (will_topic == (char *)0x0) {
    bVar4 = connect_flags & 0xc2;
  }
  else {
    if (will_message == (void *)0x0) {
      return -0x7ffffffa;
    }
    sVar1 = strlen(will_topic);
    if ((~connect_flags & 0x18) == 0) {
      return -0x7ffffff9;
    }
    bVar4 = connect_flags & 0xfa | 4;
    uVar5 = uVar5 + (int)will_message_size + (int)sVar1 + 4;
  }
  if (user_name == (char *)0x0) {
    bVar4 = bVar4 & 0x7f;
  }
  else {
    bVar4 = bVar4 | 0x80;
    sVar1 = strlen(user_name);
    uVar5 = uVar5 + (int)sVar1 + 2;
  }
  if (password == (char *)0x0) {
    bVar4 = bVar4 & 0xbf;
  }
  else {
    bVar4 = bVar4 | 0x40;
    sVar1 = strlen(password);
    uVar5 = uVar5 + (int)sVar1 + 2;
  }
  local_3c.remaining_length = uVar5;
  sVar2 = mqtt_pack_fixed_header(buf,bufsz,&local_3c);
  if (0 < sVar2) {
    if (bufsz - sVar2 < (ulong)uVar5) {
      sVar2 = 0;
    }
    else {
      puVar6 = buf + sVar2;
      puVar6[0] = '\0';
      puVar6[1] = '\x04';
      puVar6[2] = 'M';
      puVar6[3] = 'Q';
      (buf + sVar2 + 4)[0] = 'T';
      (buf + sVar2 + 4)[1] = 'T';
      buf[sVar2 + 6] = '\x04';
      buf[sVar2 + 7] = bVar4;
      *(uint16_t *)(buf + sVar2 + 8) = keep_alive << 8 | keep_alive >> 8;
      sVar3 = __mqtt_pack_str(buf + sVar2 + 10,__s);
      puVar6 = buf + sVar3 + sVar2 + 10;
      if (will_topic != (char *)0x0) {
        sVar2 = __mqtt_pack_str(puVar6,will_topic);
        *(ushort *)(puVar6 + sVar2) =
             (ushort)will_message_size << 8 | (ushort)will_message_size >> 8;
        memcpy((ushort *)((long)(puVar6 + sVar2) + 2),will_message,will_message_size);
        puVar6 = puVar6 + will_message_size + sVar2 + 2;
      }
      if (user_name != (char *)0x0) {
        sVar2 = __mqtt_pack_str(puVar6,user_name);
        puVar6 = puVar6 + sVar2;
      }
      if (password != (char *)0x0) {
        sVar2 = __mqtt_pack_str(puVar6,password);
        puVar6 = puVar6 + sVar2;
      }
      sVar2 = (long)puVar6 - (long)buf;
    }
  }
  return sVar2;
}

Assistant:

ssize_t mqtt_pack_connection_request(uint8_t* buf, size_t bufsz,
                                     const char* client_id,
                                     const char* will_topic,
                                     const void* will_message,
                                     size_t will_message_size,
                                     const char* user_name,
                                     const char* password,
                                     uint8_t connect_flags,
                                     uint16_t keep_alive)
{ 
    struct mqtt_fixed_header fixed_header;
    size_t remaining_length;
    const uint8_t *const start = buf;
    ssize_t rv;

    /* pack the fixed headr */
    fixed_header.control_type = MQTT_CONTROL_CONNECT;
    fixed_header.control_flags = 0x00;

    /* calculate remaining length and build connect_flags at the same time */
    connect_flags = (uint8_t) (connect_flags & ~MQTT_CONNECT_RESERVED);
    remaining_length = 10; /* size of variable header */

    if (client_id == NULL) {
        client_id = "";
    }
    /* For an empty client_id, a clean session is required */
    if (client_id[0] == '\0' && !(connect_flags & MQTT_CONNECT_CLEAN_SESSION)) {
        return MQTT_ERROR_CLEAN_SESSION_IS_REQUIRED;
    }
    /* mqtt_string length is strlen + 2 */
    remaining_length += __mqtt_packed_cstrlen(client_id);

    if (will_topic != NULL) {
        uint8_t temp;
        /* there is a will */
        connect_flags |= MQTT_CONNECT_WILL_FLAG;
        remaining_length += __mqtt_packed_cstrlen(will_topic);
        
        if (will_message == NULL) {
            /* if there's a will there MUST be a will message */
            return MQTT_ERROR_CONNECT_NULL_WILL_MESSAGE;
        }
        remaining_length += 2 + will_message_size; /* size of will_message */

        /* assert that the will QOS is valid (i.e. not 3) */
        temp = connect_flags & 0x18; /* mask to QOS */   
        if (temp == 0x18) {
            /* bitwise equality with QoS 3 (invalid)*/
            return MQTT_ERROR_CONNECT_FORBIDDEN_WILL_QOS;
        }
    } else {
        /* there is no will so set all will flags to zero */
        connect_flags &= (uint8_t)~MQTT_CONNECT_WILL_FLAG;
        connect_flags &= (uint8_t)~0x18;
        connect_flags &= (uint8_t)~MQTT_CONNECT_WILL_RETAIN;
    }

    if (user_name != NULL) {
        /* a user name is present */
        connect_flags |= MQTT_CONNECT_USER_NAME;
        remaining_length += __mqtt_packed_cstrlen(user_name);
    } else {
        connect_flags &= (uint8_t)~MQTT_CONNECT_USER_NAME;
    }

    if (password != NULL) {
        /* a password is present */
        connect_flags |= MQTT_CONNECT_PASSWORD;
        remaining_length += __mqtt_packed_cstrlen(password);
    } else {
        connect_flags &= (uint8_t)~MQTT_CONNECT_PASSWORD;
    }

    /* fixed header length is now calculated*/
    fixed_header.remaining_length = (uint32_t)remaining_length;

    /* pack fixed header and perform error checks */
    rv = mqtt_pack_fixed_header(buf, bufsz, &fixed_header);
    if (rv <= 0) {
        /* something went wrong */
        return rv;
    }
    buf += rv;
    bufsz -= (size_t)rv;

    /* check that the buffer has enough space to fit the remaining length */
    if (bufsz < fixed_header.remaining_length) {
        return 0;
    }

    /* pack the variable header */
    *buf++ = 0x00;
    *buf++ = 0x04;
    *buf++ = (uint8_t) 'M';
    *buf++ = (uint8_t) 'Q';
    *buf++ = (uint8_t) 'T';
    *buf++ = (uint8_t) 'T';
    *buf++ = MQTT_PROTOCOL_LEVEL;
    *buf++ = connect_flags;
    buf += __mqtt_pack_uint16(buf, keep_alive);

    /* pack the payload */
    buf += __mqtt_pack_str(buf, client_id);
    if (will_topic != NULL) {
        buf += __mqtt_pack_str(buf, will_topic);
        buf += __mqtt_pack_uint16(buf, (uint16_t)will_message_size);
        memcpy(buf, will_message, will_message_size);
        buf += will_message_size;
    }
    if (user_name != NULL) {
        buf += __mqtt_pack_str(buf, user_name);
    }
    if (password != NULL) {
        buf += __mqtt_pack_str(buf, password);
    }

    /* return the number of bytes that were consumed */
    return buf - start;
}